

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmlookup.cpp
# Opt level: O0

int __thiscall
CVmObjLookupTable::getp_count_entries
          (CVmObjLookupTable *this,vm_obj_id_t self,vm_val_t *retval,uint *argc)

{
  int iVar1;
  vm_lookup_ext *this_00;
  vm_lookup_val *pvVar2;
  vm_val_t *in_RDX;
  CVmObjLookupTable *in_RDI;
  vm_lookup_val *entry;
  int cnt;
  uint i;
  CVmNativeCodeDesc *in_stack_ffffffffffffffa8;
  vm_val_t *in_stack_ffffffffffffffb8;
  int local_3c;
  uint local_38;
  
  if ((getp_count_entries(unsigned_int,vm_val_t*,unsigned_int*)::desc == '\0') &&
     (iVar1 = __cxa_guard_acquire(&getp_count_entries(unsigned_int,vm_val_t*,unsigned_int*)::desc),
     iVar1 != 0)) {
    CVmNativeCodeDesc::CVmNativeCodeDesc(&getp_count_entries::desc,0);
    __cxa_guard_release(&getp_count_entries(unsigned_int,vm_val_t*,unsigned_int*)::desc);
  }
  iVar1 = CVmObject::get_prop_check_argc
                    (in_stack_ffffffffffffffb8,(uint *)in_RDI,in_stack_ffffffffffffffa8);
  if (iVar1 == 0) {
    local_3c = 0;
    local_38 = get_entry_count((CVmObjLookupTable *)0x314330);
    this_00 = get_ext(in_RDI);
    pvVar2 = vm_lookup_ext::idx_to_val(this_00,0);
    for (; local_38 != 0; local_38 = local_38 - 1) {
      if ((pvVar2->key).typ != VM_EMPTY) {
        local_3c = local_3c + 1;
      }
      pvVar2 = pvVar2 + 1;
    }
    vm_val_t::set_int(in_RDX,local_3c);
  }
  return 1;
}

Assistant:

int CVmObjLookupTable::getp_count_entries(VMG_ vm_obj_id_t self,
                                          vm_val_t *retval, uint *argc)
{
    static CVmNativeCodeDesc desc(0);
    uint i;
    int cnt;
    vm_lookup_val *entry;
    
    /* check arguments */
    if (get_prop_check_argc(retval, argc, &desc))
        return TRUE;

    /* run through the table and count in-use entries */
    for (cnt = 0, i = get_entry_count(), entry = get_ext()->idx_to_val(0) ;
         i != 0 ; --i, ++entry)
    {
        /* if the entry is not marked as free, count it as used */
        if (entry->key.typ != VM_EMPTY)
            ++cnt;
    }

    /* return the number of in-use entries we counted */
    retval->set_int(cnt);

    /* handled */
    return TRUE;
}